

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.h
# Opt level: O1

bool __thiscall irr::core::rect<int>::constrainTo(rect<int> *this,rect<int> *other)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = (other->LowerRightCorner).X;
  iVar6 = (this->UpperLeftCorner).X;
  iVar7 = (this->LowerRightCorner).X;
  if (iVar7 - iVar6 <= iVar2 - (other->UpperLeftCorner).X) {
    iVar3 = (other->LowerRightCorner).Y;
    iVar4 = (this->UpperLeftCorner).Y;
    iVar5 = (this->LowerRightCorner).Y;
    if (iVar5 - iVar4 <= iVar3 - (other->UpperLeftCorner).Y) {
      iVar7 = iVar2 - iVar7;
      if (iVar7 < 0) {
        (this->LowerRightCorner).X = iVar2;
        (this->UpperLeftCorner).X = iVar6 + iVar7;
      }
      iVar5 = iVar3 - iVar5;
      if (iVar5 < 0) {
        (this->LowerRightCorner).Y = iVar3;
        (this->UpperLeftCorner).Y = iVar4 + iVar5;
      }
      iVar2 = (other->UpperLeftCorner).X;
      iVar6 = (this->UpperLeftCorner).X - iVar2;
      if (iVar6 < 0) {
        (this->UpperLeftCorner).X = iVar2;
        (this->LowerRightCorner).X = (this->LowerRightCorner).X - iVar6;
      }
      iVar2 = (other->UpperLeftCorner).Y;
      iVar6 = (this->UpperLeftCorner).Y - iVar2;
      if (-1 < iVar6) {
        return true;
      }
      (this->UpperLeftCorner).Y = iVar2;
      piVar1 = &(this->LowerRightCorner).Y;
      *piVar1 = *piVar1 - iVar6;
      return true;
    }
  }
  return false;
}

Assistant:

T getWidth() const
	{
		return LowerRightCorner.X - UpperLeftCorner.X;
	}